

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O3

unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> __thiscall
CCoinsViewDB::Cursor(CCoinsViewDB *this)

{
  bool bVar1;
  CDBIterator *this_00;
  _func_int **pp_Var2;
  long in_RSI;
  long in_FS_OFFSET;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint256 hashBestChain;
  _func_int *local_58;
  _func_int *p_Stack_50;
  undefined1 local_48 [16];
  _func_int *local_38;
  _func_int *p_Stack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = CDBWrapper::NewIterator(*(CDBWrapper **)(in_RSI + 0x50));
  local_38 = (_func_int *)0x0;
  p_Stack_30 = (_func_int *)0x0;
  local_48._0_8_ = (COutPoint *)0x0;
  local_48._8_8_ = 0;
  bVar1 = CDBWrapper::Read<unsigned_char,uint256>
                    (*(CDBWrapper **)(in_RSI + 0x50),"BHC12CCoinsViewDB",(uint256 *)local_48);
  if (bVar1) {
    local_58 = local_38;
    p_Stack_50 = p_Stack_30;
    uVar3 = local_48._0_4_;
    uVar4 = local_48._4_4_;
    uVar5 = local_48._8_4_;
    uVar6 = local_48._12_4_;
  }
  else {
    uVar3._0_1_ = '\0';
    uVar3._1_1_ = '\0';
    uVar3._2_1_ = '\0';
    uVar3._3_1_ = '\0';
    uVar4._0_1_ = '\0';
    uVar4._1_1_ = '\0';
    uVar4._2_1_ = '\0';
    uVar4._3_1_ = '\0';
    uVar5._0_1_ = '\0';
    uVar5._1_3_ = 0;
    uVar6 = 0;
    local_58 = (_func_int *)0x0;
    p_Stack_50 = (_func_int *)0x0;
  }
  pp_Var2 = (_func_int **)operator_new(0x58);
  pp_Var2[1] = (_func_int *)CONCAT44(uVar4,uVar3);
  pp_Var2[2] = (_func_int *)CONCAT44(uVar6,uVar5);
  pp_Var2[3] = local_58;
  pp_Var2[4] = p_Stack_50;
  *pp_Var2 = (_func_int *)&PTR__CCoinsViewDBCursor_01394348;
  pp_Var2[5] = (_func_int *)this_00;
  *(undefined1 *)(pp_Var2 + 6) = 0;
  *(undefined8 *)((long)pp_Var2 + 0x34) = 0;
  *(undefined8 *)((long)pp_Var2 + 0x3c) = 0;
  *(undefined8 *)((long)pp_Var2 + 0x44) = 0;
  *(undefined8 *)((long)pp_Var2 + 0x4c) = 0;
  *(undefined4 *)((long)pp_Var2 + 0x54) = 0xffffffff;
  CDBIterator::Seek<unsigned_char>(this_00,"C12CCoinsViewDB");
  bVar1 = CDBIterator::Valid(this_00);
  if (bVar1) {
    local_48._0_8_ = (long)pp_Var2 + 0x34;
    local_48[8] = 'C';
    CDBIterator::GetKey<(anonymous_namespace)::CoinEntry>
              ((CDBIterator *)pp_Var2[5],(CoinEntry *)local_48);
    *(uchar *)(pp_Var2 + 6) = local_48[8];
  }
  else {
    *(undefined1 *)(pp_Var2 + 6) = 0;
  }
  (this->super_CCoinsView)._vptr_CCoinsView = pp_Var2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>,_true,_true>)
           (__uniq_ptr_data<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>,_true,_true>)
           this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<CCoinsViewCursor> CCoinsViewDB::Cursor() const
{
    auto i = std::make_unique<CCoinsViewDBCursor>(
        const_cast<CDBWrapper&>(*m_db).NewIterator(), GetBestBlock());
    /* It seems that there are no "const iterators" for LevelDB.  Since we
       only need read operations on it, use a const-cast to get around
       that restriction.  */
    i->pcursor->Seek(DB_COIN);
    // Cache key of first record
    if (i->pcursor->Valid()) {
        CoinEntry entry(&i->keyTmp.second);
        i->pcursor->GetKey(entry);
        i->keyTmp.first = entry.key;
    } else {
        i->keyTmp.first = 0; // Make sure Valid() and GetKey() return false
    }
    return i;
}